

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * matchid(disctx *ctx,int spos,char *v)

{
  expr *peVar1;
  int iVar2;
  matches *pmVar3;
  
  if ((ctx->line->atomsnum != spos) && (peVar1 = ctx->line->atoms[spos], peVar1->type == EXPR_ID)) {
    iVar2 = strcmp(peVar1->str,v);
    if (iVar2 == 0) {
      pmVar3 = alwaysmatches(spos + 1);
      return pmVar3;
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *matchid(struct disctx *ctx, int spos, const char *v) {
	if (spos == ctx->line->atomsnum)
		return 0;
	struct expr *e = ctx->line->atoms[spos];
	if (e->type == EXPR_ID && !strcmp(e->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}